

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O1

SpecparamDeclarationSyntax * __thiscall
slang::parsing::Parser::parseSpecparam(Parser *this,AttrList attr,SyntaxKind parentKind)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  SourceLocation location;
  SpecparamDeclaratorSyntax *pSVar3;
  undefined4 extraout_var_00;
  SpecparamDeclarationSyntax *pSVar4;
  EVP_PKEY_CTX *src;
  Info *extraout_RDX;
  Info *extraout_RDX_00;
  Info *extraout_RDX_01;
  Info *extraout_RDX_02;
  Info *src_00;
  Info *extraout_RDX_03;
  TokenKind kind;
  Token TVar5;
  Token keyword;
  Token semi;
  VariableDimensionSyntax *dim;
  SmallVector<slang::syntax::TokenOrSyntax,_4UL> buffer;
  SmallVector<slang::syntax::VariableDimensionSyntax_*,_5UL> dims;
  Token local_1b0;
  ImplicitTypeSyntax *local_1a0;
  SyntaxFactory *local_198;
  Info *local_190;
  undefined8 local_188;
  pointer local_180;
  size_t local_178;
  VariableDimensionSyntax *local_170;
  _Variadic_union<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> local_168;
  ulong local_158;
  undefined8 uStack_150;
  size_t local_148;
  pointer local_140;
  size_t local_138;
  undefined1 local_130 [16];
  SyntaxNode *local_120;
  SyntaxNode *pSStack_118;
  pointer local_108;
  Token local_f8;
  undefined1 local_e8 [24];
  undefined1 auStack_d0 [96];
  SmallVectorBase<slang::syntax::VariableDimensionSyntax_*> local_70 [2];
  
  local_178 = (size_t)attr._M_extent._M_extent_value;
  local_180 = attr._M_ptr;
  TVar5 = ParserBase::consume(&this->super_ParserBase);
  local_190 = TVar5.info;
  local_188 = TVar5._0_8_;
  local_170 = parseDimension(this);
  local_70[0].data_ = (pointer)local_70[0].firstElement;
  local_70[0].len = 0;
  local_70[0].cap = 5;
  if (local_170 != (VariableDimensionSyntax *)0x0) {
    SmallVectorBase<slang::syntax::VariableDimensionSyntax*>::
    emplace_back<slang::syntax::VariableDimensionSyntax*const&>
              ((SmallVectorBase<slang::syntax::VariableDimensionSyntax*> *)local_70,&local_170);
  }
  Token::Token(&local_f8);
  iVar2 = SmallVectorBase<slang::syntax::VariableDimensionSyntax_*>::copy
                    (local_70,(EVP_PKEY_CTX *)(this->super_ParserBase).alloc,src);
  auStack_d0._16_8_ = CONCAT44(extraout_var,iVar2);
  local_e8._8_4_ = SyntaxList;
  local_e8._16_8_ = (SyntaxNode *)0x0;
  auStack_d0._0_8_ = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)0x0;
  local_e8._0_8_ = &PTR_getChild_005b8330;
  TVar5 = ParserBase::placeholderToken(&this->super_ParserBase);
  local_198 = &this->factory;
  local_1a0 = slang::syntax::SyntaxFactory::implicitType
                        (local_198,local_f8,
                         (SyntaxList<slang::syntax::VariableDimensionSyntax> *)local_e8,TVar5);
  Token::Token(&local_1b0);
  local_e8._0_8_ = auStack_d0;
  local_e8._8_8_ = 0;
  local_e8._16_8_ = (SyntaxNode *)0x4;
  local_130 = (undefined1  [16])ParserBase::peek(&this->super_ParserBase);
  bVar1 = slang::syntax::SyntaxFacts::isNotIdOrComma(local_130._0_2_);
  if (bVar1) {
    bVar1 = ParserBase::haveDiagAtCurrentLoc(&this->super_ParserBase);
    if (!bVar1) {
      location = Token::location((Token *)local_130);
      ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x380005,location);
    }
    local_1b0 = ParserBase::expect(&this->super_ParserBase,Semicolon);
  }
  else {
    bVar1 = slang::syntax::SyntaxFacts::isIdentifierOrComma(local_130._0_2_);
    if (!bVar1) {
      ParserBase::reportMissingList
                (&this->super_ParserBase,(Token)local_130,Semicolon,&local_1b0,(DiagCode)0x380005);
      src_00 = extraout_RDX_03;
      goto LAB_0030d984;
    }
    do {
      pSVar3 = parseSpecparamDeclarator(this,parentKind);
      local_168._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)pSVar3;
      local_158 = CONCAT71(local_158._1_7_,1);
      SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_e8,
                 (TokenOrSyntax *)&local_168._M_first);
      TVar5 = ParserBase::peek(&this->super_ParserBase);
      bVar1 = slang::syntax::SyntaxFacts::isNotIdOrComma(TVar5.kind);
      iVar2 = 3;
      src_00 = extraout_RDX;
      if (TVar5.kind == Comma && !bVar1) {
        local_168._M_first._M_storage =
             (_Uninitialized<slang::parsing::Token,_true>)
             ParserBase::expect(&this->super_ParserBase,Comma);
        local_158 = local_158 & 0xffffffffffffff00;
        SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                  ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_e8,
                   (TokenOrSyntax *)&local_168._M_first);
        TVar5 = ParserBase::peek(&this->super_ParserBase);
        kind = TVar5.kind;
        bVar1 = slang::syntax::SyntaxFacts::isNotIdOrComma(kind);
        if (kind == EndOfFile || bVar1) {
          ParserBase::reportMisplacedSeparator(&this->super_ParserBase);
          src_00 = extraout_RDX_01;
        }
        else {
          src_00 = extraout_RDX_00;
          if ((local_130._0_2_ == kind) && ((Info *)local_130._8_8_ == TVar5.info)) {
            bVar1 = ParserBase::
                    skipBadTokens<&slang::syntax::SyntaxFacts::isIdentifierOrComma,&slang::syntax::SyntaxFacts::isNotIdOrComma>
                              (&this->super_ParserBase,(DiagCode)0x380005,true);
            src_00 = extraout_RDX_02;
            if (!bVar1) goto LAB_0030d933;
          }
          iVar2 = 0;
          local_130 = (undefined1  [16])TVar5;
        }
      }
LAB_0030d933:
    } while (iVar2 == 0);
    if (iVar2 != 3) goto LAB_0030d984;
    local_1b0 = ParserBase::expect(&this->super_ParserBase,Semicolon);
  }
  src_00 = local_1b0.info;
LAB_0030d984:
  local_168._8_4_ = 1;
  local_158 = 0;
  uStack_150 = 0;
  local_148 = local_178;
  local_140 = local_180;
  local_138 = local_178;
  local_168._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)&PTR_getChild_005bad98;
  iVar2 = SmallVectorBase<slang::syntax::TokenOrSyntax>::copy
                    ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_e8,
                     (EVP_PKEY_CTX *)(this->super_ParserBase).alloc,(EVP_PKEY_CTX *)src_00);
  local_108 = (pointer)CONCAT44(extraout_var_00,iVar2);
  local_130._8_4_ = 3;
  local_120 = (SyntaxNode *)0x0;
  pSStack_118 = (SyntaxNode *)0x0;
  local_130._0_8_ = &PTR_getChild_005bc0f8;
  keyword.info = local_190;
  keyword.kind = (undefined2)local_188;
  keyword._2_1_ = local_188._2_1_;
  keyword.numFlags.raw = local_188._3_1_;
  keyword.rawLen = local_188._4_4_;
  pSVar4 = slang::syntax::SyntaxFactory::specparamDeclaration
                     (local_198,
                      (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)&local_168._M_first,
                      keyword,local_1a0,
                      (SeparatedSyntaxList<slang::syntax::SpecparamDeclaratorSyntax> *)local_130,
                      local_1b0);
  if ((pointer)local_e8._0_8_ != (pointer)auStack_d0) {
    operator_delete((void *)local_e8._0_8_);
  }
  if (local_70[0].data_ != (pointer)local_70[0].firstElement) {
    operator_delete(local_70[0].data_);
  }
  return pSVar4;
}

Assistant:

SpecparamDeclarationSyntax& Parser::parseSpecparam(AttrList attr, SyntaxKind parentKind) {
    auto keyword = consume();

    auto dim = parseDimension();
    SmallVector<VariableDimensionSyntax*> dims;
    if (dim)
        dims.push_back(dim);

    auto& type = factory.implicitType(Token(), dims.copy(alloc), placeholderToken());

    Token semi;
    SmallVector<TokenOrSyntax, 4> buffer;
    parseList<isIdentifierOrComma, isNotIdOrComma>(buffer, TokenKind::Semicolon, TokenKind::Comma,
                                                   semi, RequireItems::True,
                                                   diag::ExpectedDeclarator, [this, parentKind] {
                                                       return &parseSpecparamDeclarator(parentKind);
                                                   });

    return factory.specparamDeclaration(attr, keyword, type, buffer.copy(alloc), semi);
}